

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_and_16_re_aw(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  
  uVar1 = m68ki_read_imm_16();
  uVar3 = *(uint *)((long)m68ki_cpu.dar + (ulong)(m68ki_cpu.ir >> 7 & 0x1c));
  uVar2 = m68ki_read_16_fc((int)(short)uVar1,m68ki_address_space | m68ki_cpu.s_flag);
  uVar3 = uVar2 & uVar3;
  m68ki_cpu.n_flag = uVar3 >> 8;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  m68ki_cpu.not_z_flag = uVar3 & 0xffff;
  m68ki_write_16_fc((int)(short)uVar1,m68ki_cpu.s_flag | 1,m68ki_cpu.not_z_flag);
  return;
}

Assistant:

static void m68k_op_and_16_re_aw(void)
{
	uint ea = EA_AW_16();
	uint res = DX & m68ki_read_16(ea);

	FLAG_N = NFLAG_16(res);
	FLAG_C = CFLAG_CLEAR;
	FLAG_V = VFLAG_CLEAR;
	FLAG_Z = MASK_OUT_ABOVE_16(res);

	m68ki_write_16(ea, FLAG_Z);
}